

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.cpp
# Opt level: O0

void __thiscall Archive::Archive(Archive *this,Buffer *b,bool *error)

{
  bool bVar1;
  size_type sVar2;
  long *plVar3;
  char *pcVar4;
  SubBuffer SVar5;
  undefined4 uStack_ec;
  string local_e8;
  undefined4 local_c4;
  uint8_t *local_c0;
  uint32_t uStack_b8;
  undefined4 uStack_b4;
  undefined1 local_a0 [8];
  string name;
  anon_class_24_3_713462fb increment;
  Child *c;
  child_iterator end;
  child_iterator it;
  bool *error_local;
  Buffer *b_local;
  Archive *this_local;
  
  this->data = b;
  (this->symbolTable).data = (uint8_t *)0x0;
  (this->symbolTable).len = 0;
  (this->stringTable).data = (uint8_t *)0x0;
  (this->stringTable).len = 0;
  this->firstRegularData = (uint8_t *)0x0;
  *error = false;
  sVar2 = std::vector<char,_std::allocator<char>_>::size(this->data);
  if ((sVar2 < 8) ||
     (plVar3 = (long *)std::vector<char,_std::allocator<char>_>::data(this->data),
     *plVar3 != 0xa3e686372613c21)) {
    *error = true;
    return;
  }
  child_begin((child_iterator *)&end.error,this,false);
  bVar1 = child_iterator::hasError((child_iterator *)&end.error);
  if (bVar1) {
    *error = true;
    return;
  }
  child_end((child_iterator *)&c,this);
  bVar1 = child_iterator::operator==((child_iterator *)&end.error,(child_iterator *)&c);
  if (bVar1) {
    return;
  }
  increment.c = (Child **)child_iterator::operator*((child_iterator *)&end.error);
  increment.error = (bool *)&increment.c;
  name.field_2._8_8_ = &end.error;
  increment.it = (child_iterator *)error;
  Child::getRawName_abi_cxx11_((string *)local_a0,(Child *)increment.c);
  bVar1 = std::operator==((string *)local_a0,"/");
  if (bVar1) {
    SVar5 = Child::getBuffer((Child *)increment.c);
    local_c0 = SVar5.data;
    uStack_b8 = SVar5.len;
    (this->symbolTable).data = local_c0;
    *(ulong *)&(this->symbolTable).len = CONCAT44(uStack_b4,uStack_b8);
    bVar1 = Archive::anon_class_24_3_713462fb::operator()
                      ((anon_class_24_3_713462fb *)((long)&name.field_2 + 8));
    if ((bVar1) ||
       (bVar1 = child_iterator::operator==((child_iterator *)&end.error,(child_iterator *)&c), bVar1
       )) {
      local_c4 = 1;
      goto LAB_025348f4;
    }
    Child::getRawName_abi_cxx11_(&local_e8,(Child *)increment.c);
    std::__cxx11::string::operator=((string *)local_a0,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_a0,"//");
  if (bVar1) {
    SVar5 = Child::getBuffer((Child *)increment.c);
    (this->stringTable).data = SVar5.data;
    *(ulong *)&(this->stringTable).len = CONCAT44(uStack_ec,SVar5.len);
    bVar1 = Archive::anon_class_24_3_713462fb::operator()
                      ((anon_class_24_3_713462fb *)((long)&name.field_2 + 8));
    if ((bVar1) ||
       (bVar1 = child_iterator::operator==((child_iterator *)&end.error,(child_iterator *)&c), bVar1
       )) {
      local_c4 = 1;
    }
    else {
      setFirstRegular(this,(Child *)increment.c);
      local_c4 = 1;
    }
  }
  else {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_a0);
    if (*pcVar4 == '/') {
      *error = true;
      local_c4 = 0;
    }
    else {
      setFirstRegular(this,(Child *)increment.c);
      local_c4 = 1;
    }
  }
LAB_025348f4:
  std::__cxx11::string::~string((string *)local_a0);
  return;
}

Assistant:

Archive::Archive(Buffer& b, bool& error)
  : data(b), symbolTable({nullptr, 0}), stringTable({nullptr, 0}),
    firstRegularData(nullptr) {
  error = false;
  if (data.size() < strlen(magic) ||
      memcmp(data.data(), magic, strlen(magic))) {
    error = true;
    return;
  }

  // We require GNU format archives. So the first member may be named "/" and it
  // points to the symbol table.  The next member may optionally be "//" and
  // point to a string table if a filename is too large to fit in the 16-char
  // name field of the header.
  child_iterator it = child_begin(false);
  if (it.hasError()) {
    error = true;
    return;
  }
  child_iterator end = child_end();
  if (it == end) {
    return; // Empty archive.
  }

  const Child* c = &*it;

  auto increment = [&]() {
    ++it;
    error = it.hasError();
    if (error) {
      return true;
    }
    c = &*it;
    return false;
  };

  std::string name = c->getRawName();
  if (name == "/") {
    symbolTable = c->getBuffer();
    if (increment() || it == end) {
      return;
    }
    name = c->getRawName();
  }

  if (name == "//") {
    stringTable = c->getBuffer();
    if (increment() || it == end) {
      return;
    }
    setFirstRegular(*c);
    return;
  }
  if (name[0] != '/') {
    setFirstRegular(*c);
    return;
  }
  // Not a GNU archive.
  error = true;
}